

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

int32 mkvmuxer::GetCodedUIntSize(uint64 value)

{
  uint64 value_local;
  
  if (value < 0x7f) {
    value_local._4_4_ = 1;
  }
  else if (value < 0x3fff) {
    value_local._4_4_ = 2;
  }
  else if (value < 0x1fffff) {
    value_local._4_4_ = 3;
  }
  else if (value < 0xfffffff) {
    value_local._4_4_ = 4;
  }
  else if (value < 0x7ffffffff) {
    value_local._4_4_ = 5;
  }
  else if (value < 0x3ffffffffff) {
    value_local._4_4_ = 6;
  }
  else if (value < 0x1ffffffffffff) {
    value_local._4_4_ = 7;
  }
  else {
    value_local._4_4_ = 8;
  }
  return value_local._4_4_;
}

Assistant:

int32 GetCodedUIntSize(uint64 value) {
  if (value < 0x000000000000007FULL)
    return 1;
  else if (value < 0x0000000000003FFFULL)
    return 2;
  else if (value < 0x00000000001FFFFFULL)
    return 3;
  else if (value < 0x000000000FFFFFFFULL)
    return 4;
  else if (value < 0x00000007FFFFFFFFULL)
    return 5;
  else if (value < 0x000003FFFFFFFFFFULL)
    return 6;
  else if (value < 0x0001FFFFFFFFFFFFULL)
    return 7;
  return 8;
}